

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Triple.cpp
# Opt level: O2

ArchType __thiscall llvm::Triple::getArchTypeForLLVMName(Triple *this,StringRef Name)

{
  bool bVar1;
  bool bVar2;
  AlignedCharArrayUnion<llvm::Triple::ArchType,_char,_char,_char,_char,_char,_char,_char,_char,_char>
  AVar3;
  int iVar4;
  ArchType *pAVar5;
  bool bVar6;
  bool bVar7;
  AlignedCharArray<4UL,_4UL> AVar8;
  bool bVar9;
  StringRef ArchName;
  Optional<llvm::Triple::ArchType> local_38;
  
  ArchName.Length = Name.Data;
  ArchName.Data = (char *)this;
  AVar3.super_AlignedCharArray<4UL,_4UL>.buffer = (AlignedCharArray<4UL,_4UL>)parseBPFArch(ArchName)
  ;
  local_38.Storage.hasVal = false;
  if (ArchName.Length == (char *)0xa) {
    iVar4 = bcmp(this,"aarch64_be",10);
    if (iVar4 == 0) {
      local_38.Storage.storage.super_AlignedCharArray<4UL,_4UL>.buffer[0] = '\x04';
      local_38.Storage.storage.super_AlignedCharArray<4UL,_4UL>.buffer[1] = '\0';
      local_38.Storage.storage.super_AlignedCharArray<4UL,_4UL>.buffer[2] = '\0';
      local_38.Storage.storage.super_AlignedCharArray<4UL,_4UL>.buffer[3] = '\0';
      goto LAB_0014d44a;
    }
LAB_0014d3e1:
    bVar9 = true;
    bVar2 = false;
    bVar1 = true;
LAB_0014d45d:
    if ((!bVar1 && !bVar2) && (iVar4 = bcmp(this,"arm",3), iVar4 == 0)) {
      AVar3.super_AlignedCharArray<4UL,_4UL>.buffer[0] = '\x01';
      AVar3.super_AlignedCharArray<4UL,_4UL>.buffer[1] = '\0';
      AVar3.super_AlignedCharArray<4UL,_4UL>.buffer[2] = '\0';
      AVar3.super_AlignedCharArray<4UL,_4UL>.buffer[3] = '\0';
      goto LAB_0014d55e;
    }
    if ((!bVar9 && !bVar2) && (iVar4 = bcmp(this,"armeb",5), iVar4 == 0)) {
      AVar3.super_AlignedCharArray<4UL,_4UL>.buffer[0] = '\x02';
      AVar3.super_AlignedCharArray<4UL,_4UL>.buffer[1] = '\0';
      AVar3.super_AlignedCharArray<4UL,_4UL>.buffer[2] = '\0';
      AVar3.super_AlignedCharArray<4UL,_4UL>.buffer[3] = '\0';
      goto LAB_0014d55e;
    }
    if ((!bVar1 && !bVar2) && (iVar4 = bcmp(this,"avr",3), iVar4 == 0)) {
      AVar3.super_AlignedCharArray<4UL,_4UL>.buffer[0] = '\x06';
      AVar3.super_AlignedCharArray<4UL,_4UL>.buffer[1] = '\0';
      AVar3.super_AlignedCharArray<4UL,_4UL>.buffer[2] = '\0';
      AVar3.super_AlignedCharArray<4UL,_4UL>.buffer[3] = '\0';
      goto LAB_0014d55e;
    }
    if (((char *)0x2 < ArchName.Length && !bVar2) && (iVar4 = bcmp(this,"bpf",3), iVar4 == 0))
    goto LAB_0014d55e;
    if (ArchName.Length == (char *)0x4 && !bVar2) {
      if (*(int *)&(this->Data)._M_dataplus._M_p == 0x7370696d) {
        local_38.Storage.storage.super_AlignedCharArray<4UL,_4UL>.buffer =
             (AlignedCharArray<4UL,_4UL>)(char  [4])0xa;
        AVar3.super_AlignedCharArray<4UL,_4UL>.buffer =
             local_38.Storage.storage.super_AlignedCharArray<4UL,_4UL>.buffer;
        goto LAB_0014d55e;
      }
      goto LAB_0014d569;
    }
    if ((ArchName.Length != (char *)0x6 || bVar2) || (iVar4 = bcmp(this,"mipsel",6), iVar4 != 0))
    goto LAB_0014d569;
    AVar8.buffer[0] = '\v';
    AVar8.buffer[1] = '\0';
    AVar8.buffer[2] = '\0';
    AVar8.buffer[3] = '\0';
  }
  else {
    if (ArchName.Length == (char *)0x7) {
      iVar4 = bcmp(this,"aarch64",7);
      if (iVar4 != 0) goto LAB_0014d3e1;
      local_38.Storage.storage.super_AlignedCharArray<4UL,_4UL>.buffer[0] = '\x03';
      local_38.Storage.storage.super_AlignedCharArray<4UL,_4UL>.buffer[1] = '\0';
      local_38.Storage.storage.super_AlignedCharArray<4UL,_4UL>.buffer[2] = '\0';
      local_38.Storage.storage.super_AlignedCharArray<4UL,_4UL>.buffer[3] = '\0';
LAB_0014d44a:
      bVar1 = true;
LAB_0014d44b:
      local_38.Storage.hasVal = true;
      bVar9 = true;
      bVar2 = true;
      goto LAB_0014d45d;
    }
    bVar1 = ArchName.Length != (char *)0x3;
    if (ArchName.Length == (char *)0x3) {
      iVar4 = bcmp(this,"arc",3);
      if (iVar4 != 0) {
        bVar9 = true;
        goto LAB_0014d443;
      }
      local_38.Storage.storage.super_AlignedCharArray<4UL,_4UL>.buffer[0] = '\x05';
      local_38.Storage.storage.super_AlignedCharArray<4UL,_4UL>.buffer[1] = '\0';
      local_38.Storage.storage.super_AlignedCharArray<4UL,_4UL>.buffer[2] = '\0';
      local_38.Storage.storage.super_AlignedCharArray<4UL,_4UL>.buffer[3] = '\0';
      goto LAB_0014d44b;
    }
    bVar9 = ArchName.Length != (char *)0x5;
    if (bVar9) {
LAB_0014d443:
      bVar2 = false;
      goto LAB_0014d45d;
    }
    iVar4 = bcmp(this,"arm64",5);
    if (iVar4 != 0) {
      bVar2 = false;
      goto LAB_0014d45d;
    }
    AVar3.super_AlignedCharArray<4UL,_4UL>.buffer[0] = '\x03';
    AVar3.super_AlignedCharArray<4UL,_4UL>.buffer[1] = '\0';
    AVar3.super_AlignedCharArray<4UL,_4UL>.buffer[2] = '\0';
    AVar3.super_AlignedCharArray<4UL,_4UL>.buffer[3] = '\0';
LAB_0014d55e:
    local_38.Storage.storage.super_AlignedCharArray<4UL,_4UL>.buffer =
         (AlignedCharArray<4UL,_4UL>)(AlignedCharArray<4UL,_4UL>)AVar3;
    local_38.Storage.hasVal = true;
    bVar2 = true;
LAB_0014d569:
    bVar6 = ArchName.Length != (char *)0x6;
    bVar7 = ArchName.Length != (char *)0x4;
    if ((bVar6 || bVar2) || (iVar4 = bcmp(this,"mips64",6), iVar4 != 0)) {
      if ((ArchName.Length != (char *)0x8 || bVar2) ||
         ((this->Data)._M_dataplus._M_p != (pointer)0x6c6534367370696d)) {
        if ((bVar6 || bVar2) || (iVar4 = bcmp(this,"msp430",6), iVar4 != 0)) {
          if ((bVar9 || bVar2) || (iVar4 = bcmp(this,"nios2",5), iVar4 != 0)) {
            if ((bVar9 || bVar2) || (iVar4 = bcmp(this,"ppc64",5), iVar4 != 0)) {
              AVar8.buffer[0] = '\x10';
              AVar8.buffer[1] = '\0';
              AVar8.buffer[2] = '\0';
              AVar8.buffer[3] = '\0';
              if (((bVar9 || bVar2) || (iVar4 = bcmp(this,"ppc32",5), iVar4 != 0)) &&
                 ((bVar1 || bVar2 || (iVar4 = bcmp(this,"ppc",3), iVar4 != 0)))) {
                if ((ArchName.Length != (char *)0x7 || bVar2) ||
                   (iVar4 = bcmp(this,"ppc64le",7), iVar4 != 0)) {
                  if ((bVar7 || bVar2) || (*(int *)&(this->Data)._M_dataplus._M_p != 0x30303672)) {
                    if ((bVar6 || bVar2) || (iVar4 = bcmp(this,"amdgcn",6), iVar4 != 0)) {
                      if ((ArchName.Length != (char *)0x7 || bVar2) ||
                         (iVar4 = bcmp(this,"riscv32",7), iVar4 != 0)) {
                        if ((ArchName.Length != (char *)0x7 || bVar2) ||
                           (iVar4 = bcmp(this,"riscv64",7), iVar4 != 0)) {
                          if ((ArchName.Length != (char *)0x7 || bVar2) ||
                             (iVar4 = bcmp(this,"hexagon",7), iVar4 != 0)) {
                            if ((bVar9 || bVar2) || (iVar4 = bcmp(this,"sparc",5), iVar4 != 0)) {
                              if ((ArchName.Length != (char *)0x7 || bVar2) ||
                                 (iVar4 = bcmp(this,"sparcel",7), iVar4 != 0)) {
                                if ((ArchName.Length != (char *)0x7 || bVar2) ||
                                   (iVar4 = bcmp(this,"sparcv9",7), iVar4 != 0)) {
                                  if ((ArchName.Length != (char *)0x7 || bVar2) ||
                                     (iVar4 = bcmp(this,"systemz",7), iVar4 != 0)) {
                                    if ((bVar1 || bVar2) || (iVar4 = bcmp(this,"tce",3), iVar4 != 0)
                                       ) {
                                      if ((bVar9 || bVar2) ||
                                         (iVar4 = bcmp(this,"tcele",5), iVar4 != 0)) {
                                        if ((bVar9 || bVar2) ||
                                           (iVar4 = bcmp(this,"thumb",5), iVar4 != 0)) {
                                          if ((ArchName.Length != (char *)0x7 || bVar2) ||
                                             (iVar4 = bcmp(this,"thumbeb",7), iVar4 != 0)) {
                                            if ((bVar1 || bVar2) ||
                                               (iVar4 = bcmp(this,"x86",3), iVar4 != 0)) {
                                              if ((bVar6 || bVar2) ||
                                                 (iVar4 = bcmp(this,"x86-64",6), iVar4 != 0)) {
                                                if ((bVar9 || bVar2) ||
                                                   (iVar4 = bcmp(this,"xcore",5), iVar4 != 0)) {
                                                  if ((bVar9 || bVar2) ||
                                                     (iVar4 = bcmp(this,"nvptx",5), iVar4 != 0)) {
                                                    if ((ArchName.Length != (char *)0x7 || bVar2) ||
                                                       (iVar4 = bcmp(this,"nvptx64",7), iVar4 != 0))
                                                    {
                                                      if ((bVar7 || bVar2) ||
                                                         (*(int *)&(this->Data)._M_dataplus._M_p !=
                                                          0x3233656c)) {
                                                        if ((bVar7 || bVar2) ||
                                                           (*(int *)&(this->Data)._M_dataplus._M_p
                                                            != 0x3436656c)) {
                                                          if ((bVar9 || bVar2) ||
                                                             (iVar4 = bcmp(this,"amdil",5),
                                                             iVar4 != 0)) {
                                                            if ((ArchName.Length != (char *)0x7 ||
                                                                 bVar2) ||
                                                               (iVar4 = bcmp(this,"amdil64",7),
                                                               iVar4 != 0)) {
                                                              if ((bVar9 || bVar2) ||
                                                                 (iVar4 = bcmp(this,"hsail",5),
                                                                 iVar4 != 0)) {
                                                                if ((ArchName.Length != (char *)0x7
                                                                     || bVar2) ||
                                                                   (iVar4 = bcmp(this,"hsail64",7),
                                                                   iVar4 != 0)) {
                                                                  if ((bVar7 || bVar2) ||
                                                                     (*(int *)&(this->Data).
                                                                               _M_dataplus._M_p !=
                                                                      0x72697073)) {
                                                                    if ((bVar6 || bVar2) ||
                                                                       (iVar4 = bcmp(this,"spir64",6
                                                                                    ), iVar4 != 0))
                                                                    {
                                                                      if ((ArchName.Length !=
                                                                           (char *)0x7 || bVar2) ||
                                                                         (iVar4 = bcmp(this,
                                                  "kalimba",7), iVar4 != 0)) {
                                                    if ((bVar9 || bVar2) ||
                                                       (iVar4 = bcmp(this,"lanai",5), iVar4 != 0)) {
                                                      if ((bVar9 || bVar2) ||
                                                         (iVar4 = bcmp(this,"shave",5), iVar4 != 0))
                                                      {
                                                        if ((bVar6 || bVar2) ||
                                                           (iVar4 = bcmp(this,"wasm32",6),
                                                           iVar4 != 0)) {
                                                          if ((bVar6 || bVar2) ||
                                                             (iVar4 = bcmp(this,"wasm64",6),
                                                             iVar4 != 0)) {
                                                            if ((ArchName.Length != (char *)0xe ||
                                                                 bVar2) ||
                                                               (iVar4 = bcmp(this,"renderscript32",
                                                                             0xe), iVar4 != 0)) {
                                                              if ((ArchName.Length != (char *)0xe ||
                                                                   bVar2) ||
                                                                 (iVar4 = bcmp(this,"renderscript64"
                                                                               ,0xe), iVar4 != 0)) {
                                                                if (!bVar2) {
                                                                  return UnknownArch;
                                                                }
                                                                goto LAB_0014db6d;
                                                              }
                                                              AVar8.buffer[0] = '2';
                                                              AVar8.buffer[1] = '\0';
                                                              AVar8.buffer[2] = '\0';
                                                              AVar8.buffer[3] = '\0';
                                                            }
                                                            else {
                                                              AVar8.buffer[0] = '1';
                                                              AVar8.buffer[1] = '\0';
                                                              AVar8.buffer[2] = '\0';
                                                              AVar8.buffer[3] = '\0';
                                                            }
                                                          }
                                                          else {
                                                            AVar8.buffer[0] = '0';
                                                            AVar8.buffer[1] = '\0';
                                                            AVar8.buffer[2] = '\0';
                                                            AVar8.buffer[3] = '\0';
                                                          }
                                                        }
                                                        else {
                                                          AVar8.buffer[0] = '/';
                                                          AVar8.buffer[1] = '\0';
                                                          AVar8.buffer[2] = '\0';
                                                          AVar8.buffer[3] = '\0';
                                                        }
                                                      }
                                                      else {
                                                        AVar8.buffer[0] = '-';
                                                        AVar8.buffer[1] = '\0';
                                                        AVar8.buffer[2] = '\0';
                                                        AVar8.buffer[3] = '\0';
                                                      }
                                                    }
                                                    else {
                                                      AVar8.buffer[0] = '.';
                                                      AVar8.buffer[1] = '\0';
                                                      AVar8.buffer[2] = '\0';
                                                      AVar8.buffer[3] = '\0';
                                                    }
                                                  }
                                                  else {
                                                    AVar8.buffer[0] = ',';
                                                    AVar8.buffer[1] = '\0';
                                                    AVar8.buffer[2] = '\0';
                                                    AVar8.buffer[3] = '\0';
                                                  }
                                                  }
                                                  else {
                                                    AVar8.buffer[0] = '+';
                                                    AVar8.buffer[1] = '\0';
                                                    AVar8.buffer[2] = '\0';
                                                    AVar8.buffer[3] = '\0';
                                                  }
                                                  }
                                                  else {
                                                    AVar8.buffer[0] = '*';
                                                    AVar8.buffer[1] = '\0';
                                                    AVar8.buffer[2] = '\0';
                                                    AVar8.buffer[3] = '\0';
                                                  }
                                                  }
                                                  else {
                                                    AVar8.buffer[0] = ')';
                                                    AVar8.buffer[1] = '\0';
                                                    AVar8.buffer[2] = '\0';
                                                    AVar8.buffer[3] = '\0';
                                                  }
                                                  }
                                                  else {
                                                    AVar8.buffer[0] = '(';
                                                    AVar8.buffer[1] = '\0';
                                                    AVar8.buffer[2] = '\0';
                                                    AVar8.buffer[3] = '\0';
                                                  }
                                                  }
                                                  else {
                                                    AVar8.buffer[0] = '\'';
                                                    AVar8.buffer[1] = '\0';
                                                    AVar8.buffer[2] = '\0';
                                                    AVar8.buffer[3] = '\0';
                                                  }
                                                  }
                                                  else {
                                                    AVar8.buffer[0] = '&';
                                                    AVar8.buffer[1] = '\0';
                                                    AVar8.buffer[2] = '\0';
                                                    AVar8.buffer[3] = '\0';
                                                  }
                                                  }
                                                  else {
                                                    AVar8.buffer[0] = '%';
                                                    AVar8.buffer[1] = '\0';
                                                    AVar8.buffer[2] = '\0';
                                                    AVar8.buffer[3] = '\0';
                                                  }
                                                  }
                                                  else {
                                                    AVar8.buffer[0] = '$';
                                                    AVar8.buffer[1] = '\0';
                                                    AVar8.buffer[2] = '\0';
                                                    AVar8.buffer[3] = '\0';
                                                  }
                                                  }
                                                  else {
                                                    AVar8.buffer[0] = '#';
                                                    AVar8.buffer[1] = '\0';
                                                    AVar8.buffer[2] = '\0';
                                                    AVar8.buffer[3] = '\0';
                                                  }
                                                  }
                                                  else {
                                                    AVar8.buffer[0] = '\"';
                                                    AVar8.buffer[1] = '\0';
                                                    AVar8.buffer[2] = '\0';
                                                    AVar8.buffer[3] = '\0';
                                                  }
                                                }
                                                else {
                                                  AVar8.buffer[0] = '!';
                                                  AVar8.buffer[1] = '\0';
                                                  AVar8.buffer[2] = '\0';
                                                  AVar8.buffer[3] = '\0';
                                                }
                                              }
                                              else {
                                                AVar8.buffer[0] = ' ';
                                                AVar8.buffer[1] = '\0';
                                                AVar8.buffer[2] = '\0';
                                                AVar8.buffer[3] = '\0';
                                              }
                                            }
                                            else {
                                              AVar8.buffer[0] = '\x1f';
                                              AVar8.buffer[1] = '\0';
                                              AVar8.buffer[2] = '\0';
                                              AVar8.buffer[3] = '\0';
                                            }
                                          }
                                          else {
                                            AVar8.buffer[0] = '\x1e';
                                            AVar8.buffer[1] = '\0';
                                            AVar8.buffer[2] = '\0';
                                            AVar8.buffer[3] = '\0';
                                          }
                                        }
                                        else {
                                          AVar8.buffer[0] = '\x1d';
                                          AVar8.buffer[1] = '\0';
                                          AVar8.buffer[2] = '\0';
                                          AVar8.buffer[3] = '\0';
                                        }
                                      }
                                      else {
                                        AVar8.buffer[0] = '\x1c';
                                        AVar8.buffer[1] = '\0';
                                        AVar8.buffer[2] = '\0';
                                        AVar8.buffer[3] = '\0';
                                      }
                                    }
                                    else {
                                      AVar8.buffer[0] = '\x1b';
                                      AVar8.buffer[1] = '\0';
                                      AVar8.buffer[2] = '\0';
                                      AVar8.buffer[3] = '\0';
                                    }
                                  }
                                  else {
                                    AVar8.buffer[0] = '\x1a';
                                    AVar8.buffer[1] = '\0';
                                    AVar8.buffer[2] = '\0';
                                    AVar8.buffer[3] = '\0';
                                  }
                                }
                                else {
                                  AVar8.buffer[0] = '\x18';
                                  AVar8.buffer[1] = '\0';
                                  AVar8.buffer[2] = '\0';
                                  AVar8.buffer[3] = '\0';
                                }
                              }
                              else {
                                AVar8.buffer[0] = '\x19';
                                AVar8.buffer[1] = '\0';
                                AVar8.buffer[2] = '\0';
                                AVar8.buffer[3] = '\0';
                              }
                            }
                            else {
                              AVar8.buffer[0] = '\x17';
                              AVar8.buffer[1] = '\0';
                              AVar8.buffer[2] = '\0';
                              AVar8.buffer[3] = '\0';
                            }
                          }
                          else {
                            AVar8.buffer[0] = '\t';
                            AVar8.buffer[1] = '\0';
                            AVar8.buffer[2] = '\0';
                            AVar8.buffer[3] = '\0';
                          }
                        }
                        else {
                          AVar8.buffer[0] = '\x16';
                          AVar8.buffer[1] = '\0';
                          AVar8.buffer[2] = '\0';
                          AVar8.buffer[3] = '\0';
                        }
                      }
                      else {
                        AVar8.buffer[0] = '\x15';
                        AVar8.buffer[1] = '\0';
                        AVar8.buffer[2] = '\0';
                        AVar8.buffer[3] = '\0';
                      }
                    }
                    else {
                      AVar8.buffer[0] = '\x14';
                      AVar8.buffer[1] = '\0';
                      AVar8.buffer[2] = '\0';
                      AVar8.buffer[3] = '\0';
                    }
                  }
                  else {
                    AVar8.buffer[0] = '\x13';
                    AVar8.buffer[1] = '\0';
                    AVar8.buffer[2] = '\0';
                    AVar8.buffer[3] = '\0';
                  }
                }
                else {
                  AVar8.buffer[0] = '\x12';
                  AVar8.buffer[1] = '\0';
                  AVar8.buffer[2] = '\0';
                  AVar8.buffer[3] = '\0';
                }
              }
            }
            else {
              AVar8.buffer[0] = '\x11';
              AVar8.buffer[1] = '\0';
              AVar8.buffer[2] = '\0';
              AVar8.buffer[3] = '\0';
            }
          }
          else {
            AVar8.buffer[0] = '\x0f';
            AVar8.buffer[1] = '\0';
            AVar8.buffer[2] = '\0';
            AVar8.buffer[3] = '\0';
          }
        }
        else {
          AVar8.buffer[0] = '\x0e';
          AVar8.buffer[1] = '\0';
          AVar8.buffer[2] = '\0';
          AVar8.buffer[3] = '\0';
        }
      }
      else {
        AVar8.buffer[0] = '\r';
        AVar8.buffer[1] = '\0';
        AVar8.buffer[2] = '\0';
        AVar8.buffer[3] = '\0';
      }
    }
    else {
      AVar8.buffer[0] = '\f';
      AVar8.buffer[1] = '\0';
      AVar8.buffer[2] = '\0';
      AVar8.buffer[3] = '\0';
    }
  }
  local_38.Storage.hasVal = true;
  local_38.Storage.storage.super_AlignedCharArray<4UL,_4UL>.buffer =
       (AlignedCharArray<4UL,_4UL>)(AlignedCharArray<4UL,_4UL>)AVar8.buffer;
LAB_0014db6d:
  pAVar5 = Optional<llvm::Triple::ArchType>::getPointer(&local_38);
  return *pAVar5;
}

Assistant:

Triple::ArchType Triple::getArchTypeForLLVMName(StringRef Name) {
  Triple::ArchType BPFArch(parseBPFArch(Name));
  return StringSwitch<Triple::ArchType>(Name)
    .Case("aarch64", aarch64)
    .Case("aarch64_be", aarch64_be)
    .Case("arc", arc)
    .Case("arm64", aarch64) // "arm64" is an alias for "aarch64"
    .Case("arm", arm)
    .Case("armeb", armeb)
    .Case("avr", avr)
    .StartsWith("bpf", BPFArch)
    .Case("mips", mips)
    .Case("mipsel", mipsel)
    .Case("mips64", mips64)
    .Case("mips64el", mips64el)
    .Case("msp430", msp430)
    .Case("nios2", nios2)
    .Case("ppc64", ppc64)
    .Case("ppc32", ppc)
    .Case("ppc", ppc)
    .Case("ppc64le", ppc64le)
    .Case("r600", r600)
    .Case("amdgcn", amdgcn)
    .Case("riscv32", riscv32)
    .Case("riscv64", riscv64)
    .Case("hexagon", hexagon)
    .Case("sparc", sparc)
    .Case("sparcel", sparcel)
    .Case("sparcv9", sparcv9)
    .Case("systemz", systemz)
    .Case("tce", tce)
    .Case("tcele", tcele)
    .Case("thumb", thumb)
    .Case("thumbeb", thumbeb)
    .Case("x86", x86)
    .Case("x86-64", x86_64)
    .Case("xcore", xcore)
    .Case("nvptx", nvptx)
    .Case("nvptx64", nvptx64)
    .Case("le32", le32)
    .Case("le64", le64)
    .Case("amdil", amdil)
    .Case("amdil64", amdil64)
    .Case("hsail", hsail)
    .Case("hsail64", hsail64)
    .Case("spir", spir)
    .Case("spir64", spir64)
    .Case("kalimba", kalimba)
    .Case("lanai", lanai)
    .Case("shave", shave)
    .Case("wasm32", wasm32)
    .Case("wasm64", wasm64)
    .Case("renderscript32", renderscript32)
    .Case("renderscript64", renderscript64)
    .Default(UnknownArch);
}